

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::writeTarget
          (DeferredThirdPartyClient *this,Builder target)

{
  RpcConnectionState *pRVar1;
  RpcClient *result;
  ClientHook *pCVar2;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  DeferredThirdPartyClient *in_RSI;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> MVar3;
  _func_int **local_28;
  void *pvStack_20;
  
  pRVar1 = (in_RSI->super_RpcClient).connectionState.ptr;
  pCVar2 = ensureAccepted(in_RSI);
  if (((RpcSystemBrand *)pCVar2->brand == (pRVar1->brand).ptr) &&
     ((RpcConnectionState *)pCVar2[2].brand == pRVar1)) {
    (*pCVar2->_vptr_ClientHook[10])(this,pCVar2);
    pCVar2 = extraout_RDX_00;
  }
  else {
    (*pCVar2->_vptr_ClientHook[4])(&local_28,pCVar2);
    (this->super_RpcClient).super_ClientHook._vptr_ClientHook = local_28;
    (this->super_RpcClient).super_ClientHook.brand = pvStack_20;
    pCVar2 = extraout_RDX;
  }
  MVar3.ptr.ptr = pCVar2;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>)MVar3.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> writeTarget(
        rpc::MessageTarget::Builder target) override {
      // Someone is addressing a message to this capability. We probably need to accept it and
      // have them address the accepted capability instead.
      return connectionState->writeTarget(ensureAccepted(), target);
    }